

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtInternalEdgeUtility.cpp
# Opt level: O1

bool cbtClampNormal(cbtVector3 *edge,cbtVector3 *tri_normal_org,cbtVector3 *localContactNormalOnB,
                   cbtScalar correctedEdgeAngle,cbtVector3 *clampedLocalNormal)

{
  float fVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  cbtQuaternion local_58;
  cbtMatrix3x3 local_48;
  
  fVar8 = tri_normal_org->m_floats[0];
  fVar9 = tri_normal_org->m_floats[1];
  fVar1 = tri_normal_org->m_floats[2];
  auVar4 = vfmsub231ss_fma(ZEXT416((uint)(fVar9 * edge->m_floats[2])),
                           ZEXT416((uint)edge->m_floats[1]),ZEXT416((uint)fVar1));
  auVar5 = vfmsub231ss_fma(ZEXT416((uint)(fVar1 * edge->m_floats[0])),ZEXT416((uint)fVar8),
                           ZEXT416((uint)edge->m_floats[2]));
  fVar10 = auVar5._0_4_;
  auVar6 = vfmsub231ss_fma(ZEXT416((uint)(fVar8 * edge->m_floats[1])),ZEXT416((uint)fVar9),
                           ZEXT416((uint)edge->m_floats[0]));
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar10)),auVar4,auVar4);
  auVar5 = vfmadd231ss_fma(auVar5,auVar6,auVar6);
  if (auVar5._0_4_ < 0.0) {
    fVar7 = sqrtf(auVar5._0_4_);
  }
  else {
    auVar5 = vsqrtss_avx(auVar5,auVar5);
    fVar7 = auVar5._0_4_;
  }
  fVar7 = 1.0 / fVar7;
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar10 * localContactNormalOnB->m_floats[1])),
                           ZEXT416((uint)localContactNormalOnB->m_floats[0]),
                           ZEXT416((uint)(auVar4._0_4_ * fVar7)));
  auVar4 = vfmadd231ss_fma(auVar5,ZEXT416((uint)localContactNormalOnB->m_floats[2]),
                           ZEXT416((uint)(auVar6._0_4_ * fVar7)));
  auVar5 = vfmadd213ss_fma(ZEXT416((uint)fVar8),ZEXT416((uint)localContactNormalOnB->m_floats[0]),
                           ZEXT416((uint)(fVar9 * localContactNormalOnB->m_floats[1])));
  auVar5 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)localContactNormalOnB->m_floats[2]),
                           auVar5);
  fVar8 = atan2f(auVar4._0_4_,auVar5._0_4_);
  if ((0.0 <= correctedEdgeAngle) || (correctedEdgeAngle <= fVar8)) {
    if (correctedEdgeAngle < 0.0) {
      return false;
    }
    if (fVar8 <= correctedEdgeAngle) {
      return false;
    }
  }
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(edge->m_floats[1] * edge->m_floats[1])),
                           ZEXT416((uint)edge->m_floats[0]),ZEXT416((uint)edge->m_floats[0]));
  auVar5 = vfmadd213ss_fma(ZEXT416((uint)edge->m_floats[2]),ZEXT416((uint)edge->m_floats[2]),auVar5)
  ;
  if (auVar5._0_4_ < 0.0) {
    fVar9 = sqrtf(auVar5._0_4_);
  }
  else {
    auVar5 = vsqrtss_avx(auVar5,auVar5);
    fVar9 = auVar5._0_4_;
  }
  fVar10 = (correctedEdgeAngle - fVar8) * 0.5;
  fVar7 = sinf(fVar10);
  fVar7 = fVar7 / fVar9;
  fVar8 = edge->m_floats[0];
  fVar9 = edge->m_floats[1];
  fVar1 = edge->m_floats[2];
  local_58.super_cbtQuadWord.m_floats[3] = cosf(fVar10);
  local_58.super_cbtQuadWord.m_floats[0] = fVar7 * fVar8;
  local_58.super_cbtQuadWord.m_floats[1] = fVar7 * fVar9;
  local_58.super_cbtQuadWord.m_floats[2] = fVar7 * fVar1;
  cbtMatrix3x3::setRotation(&local_48,&local_58);
  cVar2 = localContactNormalOnB->m_floats[0];
  fVar8 = localContactNormalOnB->m_floats[1];
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * local_48.m_el[0].m_floats[1])),
                           ZEXT416((uint)cVar2),ZEXT416((uint)local_48.m_el[0].m_floats[0]));
  cVar3 = localContactNormalOnB->m_floats[2];
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)cVar3),ZEXT416((uint)local_48.m_el[0].m_floats[2]));
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * local_48.m_el[1].m_floats[1])),
                           ZEXT416((uint)cVar2),ZEXT416((uint)local_48.m_el[1].m_floats[0]));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)cVar3),ZEXT416((uint)local_48.m_el[1].m_floats[2]));
  auVar5 = vinsertps_avx(auVar5,auVar4,0x10);
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * local_48.m_el[2].m_floats[1])),
                           ZEXT416((uint)cVar2),ZEXT416((uint)local_48.m_el[2].m_floats[0]));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)cVar3),ZEXT416((uint)local_48.m_el[2].m_floats[2]));
  auVar5 = vinsertps_avx(auVar5,auVar4,0x28);
  *(undefined1 (*) [16])clampedLocalNormal->m_floats = auVar5;
  return true;
}

Assistant:

bool cbtClampNormal(const cbtVector3& edge, const cbtVector3& tri_normal_org, const cbtVector3& localContactNormalOnB, cbtScalar correctedEdgeAngle, cbtVector3& clampedLocalNormal)
{
	cbtVector3 tri_normal = tri_normal_org;
	//we only have a local triangle normal, not a local contact normal -> only normal in world space...
	//either compute the current angle all in local space, or all in world space

	cbtVector3 edgeCross = edge.cross(tri_normal).normalize();
	cbtScalar curAngle = cbtGetAngle(edgeCross, tri_normal, localContactNormalOnB);

	if (correctedEdgeAngle < 0)
	{
		if (curAngle < correctedEdgeAngle)
		{
			cbtScalar diffAngle = correctedEdgeAngle - curAngle;
			cbtQuaternion rotation(edge, diffAngle);
			clampedLocalNormal = cbtMatrix3x3(rotation) * localContactNormalOnB;
			return true;
		}
	}

	if (correctedEdgeAngle >= 0)
	{
		if (curAngle > correctedEdgeAngle)
		{
			cbtScalar diffAngle = correctedEdgeAngle - curAngle;
			cbtQuaternion rotation(edge, diffAngle);
			clampedLocalNormal = cbtMatrix3x3(rotation) * localContactNormalOnB;
			return true;
		}
	}
	return false;
}